

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void __thiscall pugi::xml_document::_move(xml_document *this,xml_document *rhs)

{
  xml_node_struct *pxVar1;
  xml_node_struct *pxVar2;
  long lVar3;
  xml_node_struct *pxVar4;
  xml_node_struct *pxVar5;
  ulong uVar6;
  uintptr_t uVar7;
  ulong uVar8;
  long *plVar9;
  
  pxVar1 = (this->super_xml_node)._root;
  pxVar2 = (rhs->super_xml_node)._root;
  pxVar5 = pxVar2->first_child;
  pxVar1[1].header = pxVar2[1].header;
  pxVar1[1].name = pxVar2[1].name;
  pxVar4 = pxVar2[1].parent;
  pxVar1[1].value = pxVar2[1].value;
  pxVar1[1].parent = pxVar4;
  this->_buffer = rhs->_buffer;
  uVar6 = pxVar1->header >> 8;
  if ((*(long *)((long)pxVar1 + (8 - uVar6)) == 0) &&
     (plVar9 = (long *)((long)pxVar1 - uVar6), plVar9[2] == 0)) {
    uVar6 = pxVar2->header;
    uVar8 = uVar6 >> 8;
    if (*(long *)((long)pxVar2 + (8 - uVar8)) != 0) {
      __assert_fail("other_page && !other_page->prev",
                    "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/pugixml/src/pugixml.cpp"
                    ,0x1bb6,"void pugi::xml_document::_move(xml_document &)");
    }
    uVar7 = (long)pxVar2 - uVar8;
    lVar3 = *(long *)(uVar7 + 0x10);
    if (lVar3 != 0) {
      if (*(uintptr_t *)(lVar3 + 8) != uVar7) {
        __assert_fail("page->prev == other_page",
                      "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/pugixml/src/pugixml.cpp"
                      ,0x1bbb,"void pugi::xml_document::_move(xml_document &)");
      }
      *(long **)(lVar3 + 8) = plVar9;
      plVar9[2] = lVar3;
      *(undefined8 *)(uVar7 + 0x10) = 0;
    }
    while( true ) {
      plVar9 = (long *)plVar9[2];
      if (plVar9 == (long *)0x0) {
        if (pxVar1->first_child != (xml_node_struct *)0x0) {
          __assert_fail("!doc->first_child",
                        "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/pugixml/src/pugixml.cpp"
                        ,0x1bd2,"void pugi::xml_document::_move(xml_document &)");
        }
        pxVar1->first_child = pxVar5;
        while( true ) {
          if (pxVar5 == (xml_node_struct *)0x0) {
            pxVar2->prev_sibling_c = (xml_node_struct *)0x0;
            pxVar2->next_sibling = (xml_node_struct *)0x0;
            pxVar2->parent = (xml_node_struct *)0x0;
            pxVar2->first_child = (xml_node_struct *)0x0;
            pxVar2->name = (char_t *)0x0;
            pxVar2->value = (char_t *)0x0;
            pxVar2->first_attribute = (xml_attribute_struct *)0x0;
            pxVar2->header = (uVar6 & 0xffffffffffffff00) + 1;
            pxVar2[1].header = uVar7;
            pxVar2[1].name = *(char_t **)(uVar7 + 0x18);
            pxVar2[1].value = (char_t *)0x0;
            pxVar2[1].parent = (xml_node_struct *)0x0;
            rhs->_buffer = (char_t *)0x0;
            return;
          }
          if (pxVar5->parent != pxVar2) break;
          pxVar5->parent = pxVar1;
          pxVar5 = pxVar5->next_sibling;
        }
        __assert_fail("node->parent == other",
                      "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/pugixml/src/pugixml.cpp"
                      ,0x1bde,"void pugi::xml_document::_move(xml_document &)");
      }
      if ((xml_node_struct *)*plVar9 != pxVar2 + 1) break;
      *plVar9 = (long)(pxVar1 + 1);
    }
    __assert_fail("page->allocator == other",
                  "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/pugixml/src/pugixml.cpp"
                  ,0x1bc6,"void pugi::xml_document::_move(xml_document &)");
  }
  __assert_fail("doc_page && !doc_page->prev && !doc_page->next",
                "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/pugixml/src/pugixml.cpp"
                ,0x1bb3,"void pugi::xml_document::_move(xml_document &)");
}

Assistant:

PUGI__FN void xml_document::_move(xml_document& rhs) PUGIXML_NOEXCEPT_IF_NOT_COMPACT
	{
		impl::xml_document_struct* doc = static_cast<impl::xml_document_struct*>(_root);
		impl::xml_document_struct* other = static_cast<impl::xml_document_struct*>(rhs._root);

		// save first child pointer for later; this needs hash access
		xml_node_struct* other_first_child = other->first_child;

	#ifdef PUGIXML_COMPACT
		// reserve space for the hash table up front; this is the only operation that can fail
		// if it does, we have no choice but to throw (if we have exceptions)
		if (other_first_child)
		{
			size_t other_children = 0;
			for (xml_node_struct* node = other_first_child; node; node = node->next_sibling)
				other_children++;

			// in compact mode, each pointer assignment could result in a hash table request
			// during move, we have to relocate document first_child and parents of all children
			// normally there's just one child and its parent has a pointerless encoding but
			// we assume the worst here
			if (!other->_hash->reserve(other_children + 1))
			{
			#ifdef PUGIXML_NO_EXCEPTIONS
				return;
			#else
				throw std::bad_alloc();
			#endif
			}
		}
	#endif

		// move allocation state
		doc->_root = other->_root;
		doc->_busy_size = other->_busy_size;

		// move buffer state
		doc->buffer = other->buffer;
		doc->extra_buffers = other->extra_buffers;
		_buffer = rhs._buffer;

	#ifdef PUGIXML_COMPACT
		// move compact hash; note that the hash table can have pointers to other but they will be "inactive", similarly to nodes removed with remove_child
		doc->hash = other->hash;
		doc->_hash = &doc->hash;

		// make sure we don't access other hash up until the end when we reinitialize other document
		other->_hash = 0;
	#endif

		// move page structure
		impl::xml_memory_page* doc_page = PUGI__GETPAGE(doc);
		assert(doc_page && !doc_page->prev && !doc_page->next);

		impl::xml_memory_page* other_page = PUGI__GETPAGE(other);
		assert(other_page && !other_page->prev);

		// relink pages since root page is embedded into xml_document
		if (impl::xml_memory_page* page = other_page->next)
		{
			assert(page->prev == other_page);

			page->prev = doc_page;

			doc_page->next = page;
			other_page->next = 0;
		}

		// make sure pages point to the correct document state
		for (impl::xml_memory_page* page = doc_page->next; page; page = page->next)
		{
			assert(page->allocator == other);

			page->allocator = doc;

		#ifdef PUGIXML_COMPACT
			// this automatically migrates most children between documents and prevents ->parent assignment from allocating
			if (page->compact_shared_parent == other)
				page->compact_shared_parent = doc;
		#endif
		}

		// move tree structure
		assert(!doc->first_child);

		doc->first_child = other_first_child;

		for (xml_node_struct* node = other_first_child; node; node = node->next_sibling)
		{
		#ifdef PUGIXML_COMPACT
			// most children will have migrated when we reassigned compact_shared_parent
			assert(node->parent == other || node->parent == doc);

			node->parent = doc;
		#else
			assert(node->parent == other);
			node->parent = doc;
		#endif
		}

		// reset other document
		new (other) impl::xml_document_struct(PUGI__GETPAGE(other));
		rhs._buffer = 0;
	}